

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cpp
# Opt level: O1

string * __thiscall
spvtools::ExtensionSetToString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,ExtensionSet *extensions)

{
  string *psVar1;
  Extension extension;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  ExtensionSet *__range1;
  iterator __begin1;
  stringstream ss;
  iterator local_1d8;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  EnumSet<spvtools::Extension>::cbegin(&local_1d8,(EnumSet<spvtools::Extension> *)this);
  sVar3 = *(long *)(this + 8) - *(long *)this >> 4;
  if (((local_1d8.set_ != (EnumSet<spvtools::Extension> *)this) || (local_1d8.bucketOffset_ != 0))
     || (local_1d8.bucketIndex_ != sVar3)) {
    do {
      extension = EnumSet<spvtools::Extension>::Iterator::operator*(&local_1d8);
      __s = ExtensionToString(extension);
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      EnumSet<spvtools::Extension>::Iterator::operator++(&local_1d8);
    } while (((local_1d8.set_ != (EnumSet<spvtools::Extension> *)this) ||
             (local_1d8.bucketOffset_ != 0)) || (local_1d8.bucketIndex_ != sVar3));
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string ExtensionSetToString(const ExtensionSet& extensions) {
  std::stringstream ss;
  for (auto extension : extensions) {
    ss << ExtensionToString(extension) << " ";
  }
  return ss.str();
}